

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

pointer __thiscall
QList<QBenchmarkMeasurerBase::Measurement>::data(QList<QBenchmarkMeasurerBase::Measurement> *this)

{
  detach(this);
  return (this->d).ptr;
}

Assistant:

pointer data() { detach(); return d->data(); }